

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

PortBundleDefinition * __thiscall
kratos::PortBundleDefinition::flip
          (PortBundleDefinition *__return_storage_ptr__,PortBundleDefinition *this)

{
  PortBundleDefinition(__return_storage_ptr__);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  ::operator=(&(__return_storage_ptr__->definitions_)._M_t,&(this->flipped_definitions_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  ::operator=(&(__return_storage_ptr__->flipped_definitions_)._M_t,&(this->definitions_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::operator=(&(__return_storage_ptr__->debug_info_)._M_t,&(this->debug_info_)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PortBundleDefinition PortBundleDefinition::flip() {
    PortBundleDefinition flipped_;
    flipped_.definitions_ = flipped_definitions_;
    flipped_.flipped_definitions_ = definitions_;
    flipped_.debug_info_ = debug_info_;
    return flipped_;
}